

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

LoadConstantNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loadconstantnd(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x42e) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x42e;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    LoadConstantNDLayerParams::LoadConstantNDLayerParams(this_00.loadconstantnd_);
    (this->layer_).loadconstantnd_ = (LoadConstantNDLayerParams *)this_00;
  }
  return (LoadConstantNDLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LoadConstantNDLayerParams* NeuralNetworkLayer::mutable_loadconstantnd() {
  if (!has_loadconstantnd()) {
    clear_layer();
    set_has_loadconstantnd();
    layer_.loadconstantnd_ = new ::CoreML::Specification::LoadConstantNDLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loadConstantND)
  return layer_.loadconstantnd_;
}